

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void SetOptionInteger(TidyDocImpl *doc,TidyOptionId optId,ulong val)

{
  TidyConfigChangeCallback UNRECOVERED_JUMPTABLE;
  ulong uVar1;
  
  UNRECOVERED_JUMPTABLE = doc->pConfigChangeCallback;
  if (UNRECOVERED_JUMPTABLE == (TidyConfigChangeCallback)0x0) {
    (doc->config).value[optId].v = val;
  }
  else {
    uVar1 = (doc->config).value[optId].v;
    (doc->config).value[optId].v = val;
    if (uVar1 != val) {
      (*UNRECOVERED_JUMPTABLE)((TidyDoc)doc,(TidyOption)(option_defs + optId));
      return;
    }
  }
  return;
}

Assistant:

static void SetOptionInteger( TidyDocImpl* doc, TidyOptionId optId, ulong val )
{
    const TidyOptionImpl* option = &option_defs[ optId ];
    ulong* optVal = &(doc->config.value[ optId ].v);
    Bool fire_callback = doc->pConfigChangeCallback && *optVal != val;

    *optVal = val;

    if ( fire_callback )
        PerformOptionChangedCallback( doc, option );
}